

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O2

Box<Dims> *
adios2::helper::IntersectionBox(Box<Dims> *__return_storage_ptr__,Box<Dims> *box1,Box<Dims> *box2)

{
  ulong *puVar1;
  ulong *puVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  size_type sVar6;
  size_type __n;
  bool bVar7;
  
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar3 = (box1->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)(box1->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
  sVar6 = 0;
  while( true ) {
    if (__n == sVar6) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&__return_storage_ptr__->first,__n);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&__return_storage_ptr__->second,__n);
      lVar5 = 0;
      while (bVar7 = __n != 0, __n = __n - 1, bVar7) {
        puVar3 = (box1->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (box2->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (*(ulong *)((long)puVar4 + lVar5) <= *(ulong *)((long)puVar3 + lVar5)) {
          puVar4 = puVar3;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&__return_storage_ptr__->first,(value_type_conflict9 *)((long)puVar4 + lVar5));
        puVar3 = (box1->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (box2->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (*(ulong *)((long)puVar3 + lVar5) <= *(ulong *)((long)puVar4 + lVar5)) {
          puVar4 = puVar3;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&__return_storage_ptr__->second,(value_type_conflict9 *)((long)puVar4 + lVar5));
        lVar5 = lVar5 + 8;
      }
      return __return_storage_ptr__;
    }
    if ((box1->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[sVar6] <
        (box2->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[sVar6]) break;
    puVar1 = (box2->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + sVar6;
    puVar2 = puVar3 + sVar6;
    sVar6 = sVar6 + 1;
    if (*puVar1 < *puVar2) {
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Box<Dims> IntersectionBox(const Box<Dims> &box1, const Box<Dims> &box2) noexcept
{
    Box<Dims> intersectionBox;
    const size_t dimensionsSize = box1.first.size();

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // Don't intercept
        if (box2.first[d] > box1.second[d] || box2.second[d] < box1.first[d])
        {
            return intersectionBox;
        }
    }

    // get the intersection box
    intersectionBox.first.reserve(dimensionsSize);
    intersectionBox.second.reserve(dimensionsSize);

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // start
        if (box1.first[d] < box2.first[d])
        {
            intersectionBox.first.push_back(box2.first[d]);
        }
        else
        {
            intersectionBox.first.push_back(box1.first[d]);
        }

        // end, must be inclusive
        if (box1.second[d] > box2.second[d])
        {
            intersectionBox.second.push_back(box2.second[d]);
        }
        else
        {
            intersectionBox.second.push_back(box1.second[d]);
        }
    }

    return intersectionBox;
}